

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O2

string * duckdb::StackTrace::ResolveStacktraceSymbols
                   (string *__return_storage_ptr__,string *pointers)

{
  unique_ptr<void_*[],_std::default_delete<void_*[]>,_true> uVar1;
  int iVar2;
  reference str;
  idx_t iVar3;
  void *__ptr;
  void *__ptr_00;
  idx_t i;
  size_type __n;
  idx_t i_1;
  ulong uVar4;
  ulong uVar5;
  idx_t i_2;
  ulong uVar6;
  allocator local_139;
  ulong *local_138;
  ulong local_130;
  ulong local_128;
  undefined8 uStack_120;
  unique_ptr<void_*[],_std::default_delete<void_*[]>,_true> callstack;
  ulong *local_108;
  ulong local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  undefined8 uStack_f0;
  int status;
  string *local_e0;
  ulong local_d8;
  ulong local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  string mangled_symbol;
  ulong *local_90;
  ulong local_88;
  ulong local_80;
  undefined8 uStack_78;
  string result;
  allocator local_50 [32];
  
  local_e0 = __return_storage_ptr__;
  ::std::__cxx11::string::string((string *)&mangled_symbol,";",local_50);
  StringUtil::Split(&splits,pointers,&mangled_symbol);
  ::std::__cxx11::string::~string((string *)&mangled_symbol);
  uVar5 = (long)splits.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)splits.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  callstack.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>._M_t.
  super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
  super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
  super__Head_base<0UL,_void_**,_false>._M_head_impl =
       (unique_ptr<void_*[],_std::default_delete<void_*[]>_>)
       operator_new__(-(ulong)(uVar5 >> 0x3d != 0) |
                      (long)splits.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)splits.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2);
  for (__n = 0; uVar1.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>._M_t.
                super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
                super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                super__Head_base<0UL,_void_**,_false>._M_head_impl =
                     callstack.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>._M_t.
                     super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                     super__Head_base<0UL,_void_**,_false>._M_head_impl, uVar5 != __n; __n = __n + 1
      ) {
    str = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ::get<true>(&splits,__n);
    iVar3 = StringUtil::ToUnsigned(str);
    uVar1 = callstack;
    unique_ptr<void_*[],_std::default_delete<void_*[]>,_true>::AssertNotNull
              (callstack.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>._M_t.
               super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
               super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
               super__Head_base<0UL,_void_**,_false>._M_head_impl ==
               (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)0x0);
    *(idx_t *)((long)uVar1.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>._M_t.
                     super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                     super__Head_base<0UL,_void_**,_false>._M_head_impl + __n * 8) = iVar3;
  }
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  local_d8 = uVar5;
  iVar2 = NumericCastImpl<int,_unsigned_long,_false>::Convert(uVar5);
  __ptr = (void *)backtrace_symbols(uVar1.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                                    super__Head_base<0UL,_void_**,_false>._M_head_impl,iVar2);
  uVar5 = 0;
  do {
    if (uVar5 == local_d8) {
      free(__ptr);
      ::std::operator+(local_e0,anon_var_dwarf_4b71d2e + 8,&result);
      ::std::__cxx11::string::~string((string *)&result);
      std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::~unique_ptr
                (&callstack.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&splits);
      return local_e0;
    }
    local_d0 = uVar5;
    ::std::__cxx11::string::string
              ((string *)&local_108,*(char **)((long)__ptr + uVar5 * 8),&local_139);
    for (uVar5 = 0;
        (uVar6 = local_100, uVar4 = local_100, local_100 != uVar5 &&
        (uVar6 = uVar5, uVar4 = uVar5, *(char *)((long)local_108 + uVar5) != '_'));
        uVar5 = uVar5 + 1) {
    }
    for (; uVar6 < local_100; uVar6 = uVar6 + 1) {
      if (((ulong)*(byte *)((long)local_108 + uVar6) < 0x2c) &&
         ((0xa0100003e00U >> ((ulong)*(byte *)((long)local_108 + uVar6) & 0x3f) & 1) != 0))
      goto LAB_00330c15;
    }
    uVar6 = 0;
LAB_00330c15:
    if (uVar4 < uVar6) {
      ::std::__cxx11::string::substr((ulong)&mangled_symbol,(ulong)&local_108);
      __ptr_00 = (void *)__cxa_demangle(mangled_symbol._M_dataplus._M_p,0,0,&status);
      if (status == 0 && __ptr_00 != (void *)0x0) {
        local_130 = 0;
        local_128 = local_128 & 0xffffffffffffff00;
        local_138 = &local_128;
        ::std::__cxx11::string::substr((ulong)local_50,(ulong)&local_108);
        ::std::__cxx11::string::append((string *)&local_138);
        ::std::__cxx11::string::~string((string *)local_50);
        ::std::__cxx11::string::append((char *)&local_138);
        ::std::__cxx11::string::substr((ulong)local_50,(ulong)&local_108);
        ::std::__cxx11::string::append((string *)&local_138);
        ::std::__cxx11::string::~string((string *)local_50);
        free(__ptr_00);
      }
      else {
        if (local_108 == (ulong *)&local_f8) {
          uStack_120 = uStack_f0;
          local_138 = &local_128;
        }
        else {
          local_138 = local_108;
        }
        local_128 = CONCAT71(uStack_f7,local_f8);
        local_130 = local_100;
        local_100 = 0;
        local_f8 = 0;
        local_108 = (ulong *)&local_f8;
      }
      ::std::__cxx11::string::~string((string *)&mangled_symbol);
    }
    else {
      local_138 = local_108;
      if (local_108 == (ulong *)&local_f8) {
        uStack_120 = uStack_f0;
        local_138 = &local_128;
      }
      local_128 = CONCAT71(uStack_f7,local_f8);
      local_130 = local_100;
      local_100 = 0;
      local_f8 = 0;
      local_108 = (ulong *)&local_f8;
    }
    local_90 = local_138;
    if (local_138 == &local_128) {
      uStack_78 = uStack_120;
      local_90 = &local_80;
    }
    local_80 = local_128;
    local_88 = local_130;
    local_130 = 0;
    local_128 = local_128 & 0xffffffffffffff00;
    local_138 = &local_128;
    ::std::__cxx11::string::append((string *)&result);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_138);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::append((char *)&result);
    uVar5 = local_d0 + 1;
  } while( true );
}

Assistant:

string StackTrace::ResolveStacktraceSymbols(const string &pointers) {
	auto splits = StringUtil::Split(pointers, ";");
	idx_t frame_count = splits.size();
	auto callstack = unique_ptr<void *[]>(new void *[frame_count]);
	for (idx_t i = 0; i < frame_count; i++) {
		callstack[i] = cast_uint64_to_pointer(StringUtil::ToUnsigned(splits[i]));
	}
	string result;
	char **strs = backtrace_symbols(callstack.get(), NumericCast<int>(frame_count));
	for (idx_t i = 0; i < frame_count; i++) {
		result += CleanupStackTrace(UnmangleSymbol(strs[i]));
		result += "\n";
	}
	free(reinterpret_cast<void *>(strs));
	return "\n" + result;
}